

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

void __thiscall
icu_63::Formattable::populateDecimalQuantity
          (Formattable *this,DecimalQuantity *output,UErrorCode *status)

{
  Type TVar1;
  int32_t n;
  int64_t n_00;
  double n_01;
  UErrorCode *status_local;
  DecimalQuantity *output_local;
  Formattable *this_local;
  
  if (this->fDecimalQuantity == (DecimalQuantity *)0x0) {
    TVar1 = this->fType;
    if (TVar1 == kDouble) {
      n_01 = getDouble(this);
      icu_63::number::impl::DecimalQuantity::setToDouble(output,n_01);
      icu_63::number::impl::DecimalQuantity::roundToInfinity(output);
    }
    else if (TVar1 == kLong) {
      n = getLong(this);
      icu_63::number::impl::DecimalQuantity::setToInt(output,n);
    }
    else if (TVar1 == kInt64) {
      n_00 = getInt64(this);
      icu_63::number::impl::DecimalQuantity::setToLong(output,n_00);
    }
    else {
      *status = U_INVALID_STATE_ERROR;
    }
  }
  else {
    icu_63::number::impl::DecimalQuantity::operator=(output,this->fDecimalQuantity);
  }
  return;
}

Assistant:

void
Formattable::populateDecimalQuantity(number::impl::DecimalQuantity& output, UErrorCode& status) const {
    if (fDecimalQuantity != nullptr) {
        output = *fDecimalQuantity;
        return;
    }

    switch (fType) {
        case kDouble:
            output.setToDouble(this->getDouble());
            output.roundToInfinity();
            break;
        case kLong:
            output.setToInt(this->getLong());
            break;
        case kInt64:
            output.setToLong(this->getInt64());
            break;
        default:
            // The formattable's value is not a numeric type.
            status = U_INVALID_STATE_ERROR;
    }
}